

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O0

void __thiscall
InternalFixupSectionNames_SectionName_Test::~InternalFixupSectionNames_SectionName_Test
          (InternalFixupSectionNames_SectionName_Test *this)

{
  ~InternalFixupSectionNames_SectionName_Test
            ((InternalFixupSectionNames_SectionName_Test *)
             &this[-1].super_InternalFixupSectionNames.super_InternalFixupMembersImport.super_Test.
              gtest_flag_saver_);
  return;
}

Assistant:

TEST_P (InternalFixupSectionNames, SectionName) {
    auto const & ns = GetParam ();
    std::ostringstream os;
    os << R"({ "section" : ")" << std::get<pstore::gsl::czstring> (ns)
       << R"(", "type":17, "offset":19, "addend":-23 })";

    internal_fixup_collection fixups;
    auto const & parser = this->parse (os.str (), &fixups);
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();

    ASSERT_EQ (fixups.size (), 1U);
    EXPECT_EQ (fixups[0].section, std::get<pstore::repo::section_kind> (ns));
    EXPECT_EQ (fixups[0].type, 17U);
    EXPECT_EQ (fixups[0].offset, 19U);
    EXPECT_EQ (fixups[0].addend, -23);
}